

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueCase::verifySampleBuffers
          (SampleMaskUniqueCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  long lVar1;
  ostringstream *poVar2;
  int width;
  int height;
  Surface *resultImage;
  byte bVar3;
  pointer pSVar4;
  bool bVar5;
  long *plVar6;
  TestLog *pTVar7;
  uint uVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  pointer pSVar11;
  bool bVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  void *pvVar17;
  pointer pSVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ArrayBuffer<unsigned_int,_4UL,_4UL> *pAVar22;
  float fVar23;
  Surface errorMask;
  vector<int,_std::allocator<int>_> maskBitIndices;
  string local_388;
  Surface local_368;
  pointer local_350;
  uint local_344;
  LogImageSet local_340;
  string local_300;
  vector<int,_std::allocator<int>_> local_2e0;
  string local_2c8;
  TextureFormat local_2a8;
  ConstPixelBufferAccess local_2a0;
  string local_278;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [6];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [4];
  ios_base local_150 [8];
  ios_base local_148 [268];
  IVec3 local_3c;
  
  pSVar18 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
            .super__Vector_impl_data._M_start;
  width = pSVar18->m_width;
  height = pSVar18->m_height;
  pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_258._0_8_ = &local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"SampleBuffers","");
  local_340.m_name._M_dataplus._M_p = (pointer)&local_340.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Image sample buffers","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_1c0,(string *)local_258,&local_340.m_name);
  tcu::TestLog::startImageSet(pTVar7,(char *)local_1c0._0_8_,local_1a0._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p,local_190[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,local_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    local_340.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._0_8_ != &local_248) {
    operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(resultBuffers->
                              super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(resultBuffers->
                             super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar20 = 0x10;
    lVar13 = 0;
    do {
      pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
               ->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::ostream::operator<<((ConstPixelBufferAccess *)local_1c0,(int)lVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base(local_150);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x1cb4214);
      local_340.m_name._M_dataplus._M_p = (pointer)&local_340.m_name.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_340.m_name.field_2._M_allocated_capacity = *psVar9;
        local_340.m_name.field_2._8_8_ = plVar6[3];
      }
      else {
        local_340.m_name.field_2._M_allocated_capacity = *psVar9;
        local_340.m_name._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_340.m_name._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::ostream::operator<<((ConstPixelBufferAccess *)local_1c0,(int)lVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base(local_150);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1c44cd2);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_388.field_2._M_allocated_capacity = *psVar9;
        local_388.field_2._8_8_ = plVar6[3];
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      }
      else {
        local_388.field_2._M_allocated_capacity = *psVar9;
        local_388._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_388._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pSVar18 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_2c8._M_dataplus._M_p = (pointer)0x300000008;
      pvVar17 = *(void **)((long)&pSVar18->m_width + lVar20);
      if (pvVar17 != (void *)0x0) {
        pvVar17 = *(void **)((long)pSVar18 + lVar20 + -8);
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_1c0,(TextureFormat *)&local_2c8,
                 *(int *)((long)pSVar18 + lVar20 + -0x10),*(int *)((long)pSVar18 + lVar20 + -0xc),1,
                 pvVar17);
      pCVar10 = (ConstPixelBufferAccess *)local_1c0;
      tcu::LogImage::LogImage
                ((LogImage *)local_258,&local_340.m_name,&local_388,
                 (ConstPixelBufferAccess *)local_1c0,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_258,(int)pTVar7,__buf,(size_t)pCVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != local_228) {
        operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ != &local_248) {
        operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
        operator_delete(local_340.m_name._M_dataplus._M_p,
                        local_340.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_2a0.m_format != (TextureFormat)(local_2a0.m_size.m_data + 2)) {
        operator_delete((void *)local_2a0.m_format,local_2a0._16_8_ + 1);
      }
      lVar13 = lVar13 + 1;
      lVar20 = lVar20 + 0x18;
    } while (lVar13 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  tcu::TestLog::endImageSet
            (((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  local_1c0._0_8_ =
       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             "Verifying fragment shader invocation found only one set sample mask bit.",0x48);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_148);
  if ((int)((ulong)((long)(resultBuffers->
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(resultBuffers->
                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * -0x55555555 < 1) {
    bVar12 = true;
  }
  else {
    poVar2 = (ostringstream *)(local_1c0 + 8);
    bVar12 = true;
    lVar20 = 0;
    lVar13 = 0;
    do {
      local_1c0._0_8_ =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Verifying sample ",0x11)
      ;
      lVar13 = lVar13 + 1;
      std::ostream::operator<<(poVar2,(int)lVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
      std::ostream::operator<<
                (poVar2,(int)((ulong)((long)(resultBuffers->
                                            super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(resultBuffers->
                                           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_148);
      local_1c0._0_8_ = &PTR_verify_021562b0;
      bVar5 = verifyImageWithVerifier
                        ((Surface *)
                         ((long)&((resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->m_width + lVar20),
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx)->m_log,(Verifier *)local_1c0,false);
      bVar12 = (bool)(bVar12 & bVar5);
      lVar20 = lVar20 + 0x18;
    } while (lVar13 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
    if (bVar12 == false) {
      local_1c0._0_8_ =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1c0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Could not get mask information from the rendered image, cannot continue verification."
                 ,0x55);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_148);
      return false;
    }
  }
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    local_1c0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Verifying sample mask bit index is 0.",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_148);
    resultImage = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
    local_258._0_4_ = R;
    local_258._4_4_ = SNORM_INT8;
    local_258._8_8_ = (ulong)(uint)local_258._12_4_ << 0x20;
    local_3c.m_data[0] = 0xff;
    local_3c.m_data[1] = 8;
    local_3c.m_data[2] = 0xff;
    ColorVerifier::ColorVerifier((ColorVerifier *)local_1c0,(Vec3 *)local_258,&local_3c);
    bVar12 = verifyImageWithVerifier(resultImage,pTVar7,(Verifier *)local_1c0,false);
  }
  else {
    tcu::Surface::Surface(&local_368,width,height);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_2e0,
               ((long)(resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (allocator_type *)local_1c0);
    local_258._0_4_ = RGBA;
    local_258._4_4_ = UNORM_INT8;
    pvVar17 = (void *)local_368.m_pixels.m_cap;
    if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
      pvVar17 = local_368.m_pixels.m_ptr;
    }
    uVar16 = 0;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c0,(TextureFormat *)local_258,local_368.m_width,
               local_368.m_height,1,pvVar17);
    local_258._0_4_ = R;
    local_258._4_4_ = 0x3f800000;
    local_258._8_8_ = 0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_1c0,(Vec4 *)local_258);
    local_1c0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Verifying per-invocation sample mask bit is unique.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_148);
    if (0 < height) {
      poVar2 = (ostringstream *)(local_1c0 + 8);
      uVar21 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
      iVar19 = 0;
      iVar14 = 0;
      do {
        if (0 < width) {
          pSVar18 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar11 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
          iVar15 = 0;
          do {
            uVar8 = (int)((long)pSVar11 - (long)pSVar18 >> 3) * -0x55555555;
            if (0 < (int)uVar8) {
              local_344 = (uint)uVar21;
              local_350 = local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              uVar21 = 0;
              pSVar4 = pSVar18;
              do {
                pAVar22 = &pSVar4->m_pixels;
                fVar23 = floorf((float)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                       super_MultisampleRenderCase.m_numTargetSamples *
                                ((float)*(byte *)((long)pAVar22->m_ptr +
                                                 (long)(*(int *)((long)(pAVar22 + -1) + 8) * iVar14
                                                       + iVar15) * 4 + 1) / 255.0) + 0.5);
                local_350[uVar21] = (int)fVar23;
                uVar21 = uVar21 + 1;
                pSVar4 = (pointer)(pAVar22 + 1);
              } while ((uVar8 & 0x7fffffff) != uVar21);
              lVar20 = 1;
              bVar3 = 0;
              uVar21 = (ulong)local_344;
              lVar13 = 0;
              do {
                lVar1 = lVar13 + 1;
                bVar5 = (bool)(4 < iVar19 & bVar3);
                local_350 = (pointer)lVar20;
                if (lVar1 < (int)((ulong)((long)pSVar11 - (long)pSVar18) >> 3) * -0x55555555) {
                  do {
                    if (bVar5) break;
                    if (local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar13] ==
                        local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar20]) {
                      iVar19 = iVar19 + 1;
                      if (iVar19 < 6) {
                        local_1c0._0_8_ =
                             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                              super_MultisampleRenderCase.super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream(poVar2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar2,"Pixel (",7);
                        std::ostream::operator<<(poVar2,iVar15);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2)
                        ;
                        std::ostream::operator<<(poVar2,iVar14);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar2,"): Samples ",0xb);
                        std::ostream::operator<<(poVar2,(int)lVar13);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar2," and ",5);
                        std::ostream::operator<<(poVar2,(int)lVar20);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar2,
                                   " have the same sample mask. (Single bit at index ",0x31);
                        std::ostream::operator<<
                                  (poVar2,local_2e0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[lVar13]);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1c0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream(poVar2);
                        std::ios_base::~ios_base(local_148);
                        pSVar18 = (resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
                        pSVar11 = (resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_finish;
                      }
                      *(undefined4 *)
                       ((long)local_368.m_pixels.m_ptr +
                       (long)(local_368.m_width * iVar14 + iVar15) * 4) = 0xff0000ff;
                      bVar3 = 1;
                      uVar21 = 0;
                    }
                    lVar20 = lVar20 + 1;
                    bVar5 = (bool)(4 < iVar19 & bVar3);
                  } while (lVar20 < (int)((ulong)((long)pSVar11 - (long)pSVar18) >> 3) * -0x55555555
                          );
                }
              } while ((lVar1 < (int)((ulong)((long)pSVar11 - (long)pSVar18) >> 3) * -0x55555555) &&
                      (lVar20 = (long)local_350 + 1, lVar13 = lVar1, !bVar5));
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 != width);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != height);
      if ((uVar21 & 1) == 0) {
        if (5 < iVar19) {
          local_1c0._0_8_ =
               ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
               ->m_log;
          poVar2 = (ostringstream *)(local_1c0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"...\n",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Omitted ",8);
          std::ostream::operator<<(poVar2,iVar19 + -5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," error descriptions.",0x14);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_148);
        }
        local_1c0._0_8_ =
             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar2 = (ostringstream *)(local_1c0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Image verification failed.",0x1a);
        pTVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Verification","");
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_300,"Image Verification","");
        tcu::LogImageSet::LogImageSet(&local_340,&local_388,&local_300);
        tcu::TestLog::startImageSet
                  (pTVar7,local_340.m_name._M_dataplus._M_p,local_340.m_description._M_dataplus._M_p
                  );
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ErrorMask","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Error Mask","");
        local_2a8.order = RGBA;
        local_2a8.type = UNORM_INT8;
        if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
          local_368.m_pixels.m_cap = (size_t)local_368.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_2a0,&local_2a8,local_368.m_width,local_368.m_height,1
                   ,(void *)local_368.m_pixels.m_cap);
        pCVar10 = &local_2a0;
        tcu::LogImage::LogImage
                  ((LogImage *)local_258,&local_2c8,&local_278,pCVar10,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_258,(int)pTVar7,__buf_00,(size_t)pCVar10);
        tcu::TestLog::endImageSet(pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_p != local_228) {
          operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != &local_248) {
          operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340.m_description._M_dataplus._M_p != &local_340.m_description.field_2) {
          operator_delete(local_340.m_description._M_dataplus._M_p,
                          local_340.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
          operator_delete(local_340.m_name._M_dataplus._M_p,
                          local_340.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_148);
        bVar12 = false;
      }
    }
    if (local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_368);
  }
  return bVar12;
}

Assistant:

bool SampleMaskUniqueCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;

	// Log samples
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// check for earlier errors (in fragment shader)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying fragment shader invocation found only one set sample mask bit." << tcu::TestLog::EndMessage;

		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			allOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!allOk)
		{
			// can't check the uniqueness if the masks don't work at all
			m_testCtx.getLog() << tcu::TestLog::Message << "Could not get mask information from the rendered image, cannot continue verification." << tcu::TestLog::EndMessage;
			return false;
		}
	}

	// verify index / index ranges

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect index=0

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask bit index is 0." << tcu::TestLog::EndMessage;

		// only check the mask index
		allOk &= verifyImageWithVerifier(resultBuffers[0], m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::IVec3(255, 8, 255)), false);
	}
	else
	{
		// check uniqueness

		tcu::Surface		errorMask		(width, height);
		bool				uniquenessOk	= true;
		int					printCount		= 0;
		const int			printFloodLimit	= 5;
		std::vector<int>	maskBitIndices	(resultBuffers.size());

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying per-invocation sample mask bit is unique." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool maskNdxNotUnique = false;

			// decode index
			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				maskBitIndices[sampleNdx] = (int)deFloatRound((float)color.getGreen() / 255.0f * (float)m_numTargetSamples);
			}

			// just check there are no two invocations with the same bit index
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (maskBitIndices[sampleNdxA] == maskBitIndices[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same sample mask. (Single bit at index " << maskBitIndices[sampleNdxA] << ")"
							<< tcu::TestLog::EndMessage;
					}

					maskNdxNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	return allOk;
}